

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O3

CompatibilityTestType __thiscall deqp::gls::DrawTestSpec::isCompatibilityTest(DrawTestSpec *this)

{
  int iVar1;
  CompatibilityTestType CVar2;
  int iVar3;
  pointer pAVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  pointer pAVar8;
  uint uVar9;
  ulong uVar10;
  
  pAVar8 = (this->attribs).
           super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = (int)((long)(this->attribs).
                      super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar8 >> 3) * -0x33333333;
  if ((int)uVar9 < 1) {
    bVar6 = false;
  }
  else {
    uVar10 = (ulong)(uVar9 & 0x7fffffff);
    pAVar4 = pAVar8;
    bVar5 = false;
    do {
      if (pAVar4->storage == STORAGE_BUFFER) {
        iVar7 = 4;
        if ((pAVar4->inputType & ~INPUTTYPE_FIXED) != INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
          iVar7 = inputTypeSize::size[(int)pAVar4->inputType];
        }
        bVar6 = true;
        if (pAVar4->offset % iVar7 == 0) goto LAB_01867cf9;
      }
      else {
LAB_01867cf9:
        bVar6 = bVar5;
      }
      pAVar4 = pAVar4 + 1;
      uVar10 = uVar10 - 1;
      bVar5 = bVar6;
    } while (uVar10 != 0);
    if (0 < (int)uVar9) {
      uVar10 = (ulong)(uVar9 & 0x7fffffff);
      iVar7 = 0;
      do {
        if (pAVar8->storage == STORAGE_BUFFER) {
          iVar3 = 4;
          if ((pAVar8->inputType & ~INPUTTYPE_FIXED) != INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
            iVar3 = inputTypeSize::size[(int)pAVar8->inputType];
          }
          iVar1 = 1;
          if (pAVar8->stride % iVar3 == 0) goto LAB_01867d3f;
        }
        else {
LAB_01867d3f:
          iVar1 = iVar7;
        }
        iVar7 = iVar1;
        pAVar8 = pAVar8 + 1;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
      CVar2 = iVar7 * 2;
      goto LAB_01867d5c;
    }
  }
  CVar2 = COMPATIBILITY_NONE;
LAB_01867d5c:
  if (((*(uint *)(gls::(anonymous_namespace)::getMethodInfo(deqp::gls::DrawTestSpec::DrawMethod)::
                  infos + (long)(int)this->drawMethod * 6) & 1) != 0) &&
     (this->indexStorage == STORAGE_BUFFER)) {
    uVar9 = 0xffffffff;
    if ((ulong)this->indexType < 3) {
      uVar9 = *(uint *)(&DAT_01cb9408 + (ulong)this->indexType * 4);
    }
    bVar6 = (bool)(bVar6 | (this->indexPointerOffset & uVar9) != 0);
  }
  if (bVar6) {
    CVar2 = COMPATIBILITY_UNALIGNED_OFFSET;
  }
  return CVar2;
}

Assistant:

DrawTestSpec::CompatibilityTestType DrawTestSpec::isCompatibilityTest (void) const
{
	const MethodInfo methodInfo = getMethodInfo(drawMethod);

	bool bufferAlignmentBad = false;
	bool strideAlignmentBad = false;

	// Attribute buffer alignment
	for (int ndx = 0; ndx < (int)attribs.size(); ++ndx)
		if (!attribs[ndx].isBufferAligned())
			bufferAlignmentBad = true;

	// Attribute stride alignment
	for (int ndx = 0; ndx < (int)attribs.size(); ++ndx)
		if (!attribs[ndx].isBufferStrideAligned())
			strideAlignmentBad = true;

	// Index buffer alignment
	if (methodInfo.indexed)
	{
		if (indexStorage == STORAGE_BUFFER)
		{
			int indexSize = 0;
			if (indexType == INDEXTYPE_BYTE)
				indexSize = 1;
			else if (indexType == INDEXTYPE_SHORT)
				indexSize = 2;
			else if (indexType == INDEXTYPE_INT)
				indexSize = 4;
			else
				DE_ASSERT(DE_FALSE);

			if (indexPointerOffset % indexSize != 0)
				bufferAlignmentBad = true;
		}
	}

	// \note combination bad alignment & stride is treated as bad offset
	if (bufferAlignmentBad)
		return COMPATIBILITY_UNALIGNED_OFFSET;
	else if (strideAlignmentBad)
		return COMPATIBILITY_UNALIGNED_STRIDE;
	else
		return COMPATIBILITY_NONE;
}